

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O2

bool BicTest3<Blob<88>,unsigned_int>(pfHash hash,int reps,bool verbose)

{
  int *piVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  int out2;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int keybit;
  ulong uVar11;
  int out1;
  ulong uVar12;
  bool bVar13;
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined8 in_XMM7_Qb;
  uint local_a8;
  allocator_type local_a1;
  double local_a0;
  ulong local_98;
  uint h2;
  uint h1;
  long local_88;
  ulong local_80;
  long local_78;
  value_type_conflict1 local_6c;
  vector<int,_std::allocator<int>_> bins;
  Rand r;
  Blob<88> key;
  
  Rand::reseed(&r,0x2ea2);
  Blob<88>::Blob(&key);
  local_6c = 0;
  std::vector<int,_std::allocator<int>_>::vector(&bins,0x58000,&local_6c,&local_a1);
  local_a0 = (double)CONCAT44(local_a0._4_4_,~(reps >> 0x1f) & reps);
  local_98 = 0x10;
  for (uVar2 = 0; uVar2 != 0x58; uVar2 = uVar2 + 1) {
    if ((uVar2 & 7) == 0) {
      putchar(0x2e);
    }
    lVar9 = (long)bins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_start + local_98;
    for (iVar5 = 0; iVar5 != local_a0._0_4_; iVar5 = iVar5 + 1) {
      Rand::rand_p(&r,&key,0xb);
      (*hash)(&key,0xb,0,&h1);
      flipbit<Blob<88>>(&key,(uint32_t)uVar2);
      (*hash)(&key,0xb,0,&h2);
      lVar4 = -0x1f;
      lVar3 = lVar9;
      for (lVar6 = 0; lVar6 != 0x1f; lVar6 = lVar6 + 1) {
        lVar7 = lVar3;
        for (lVar8 = lVar4; lVar8 != 0; lVar8 = lVar8 + 1) {
          piVar1 = (int *)(lVar7 + (ulong)(((h2 ^ h1) >> ((uint)lVar6 & 0x1f) & 1) +
                                          ((h2 ^ h1) >> ((uint)lVar8 & 0x1f) & 1) * 2) * 4);
          *piVar1 = *piVar1 + 1;
          lVar7 = lVar7 + 0x10;
        }
        lVar4 = lVar4 + 1;
        lVar3 = lVar3 + 0x210;
      }
    }
    local_98 = local_98 + 0x4000;
  }
  putchar(10);
  dVar18 = (double)(reps / 2);
  auVar14 = ZEXT864(0) << 0x40;
  uVar2 = 1;
  auVar19 = ZEXT1664(ZEXT816(0x4000000000000000));
  auVar20 = ZEXT1664(ZEXT816(0xbff0000000000000));
  auVar21 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
  local_88 = 0x10;
  uVar10 = 0;
  local_98 = local_98 & 0xffffffff00000000;
  local_a8 = 0;
  local_a0 = dVar18;
  for (uVar12 = 0; lVar9 = local_88, uVar11 = uVar2, uVar12 != 0x1f; uVar12 = uVar12 + 1) {
    for (; local_80 = uVar11, uVar2 != 0x20; uVar2 = uVar2 + 1) {
      if (verbose) {
        printf("(%3d,%3d) - ",uVar12 & 0xffffffff,uVar2 & 0xffffffff);
        auVar21 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
        auVar20 = ZEXT1664(ZEXT816(0xbff0000000000000));
        auVar19 = ZEXT1664(ZEXT816(0x4000000000000000));
        auVar14 = ZEXT864(auVar14._0_8_);
        dVar18 = local_a0;
      }
      local_78 = lVar9;
      for (uVar11 = 0; uVar11 != 0x58; uVar11 = uVar11 + 1) {
        auVar17 = ZEXT816(0) << 0x40;
        lVar4 = 0;
        while (lVar4 != 4) {
          lVar3 = lVar4 * 4;
          lVar4 = lVar4 + 1;
          auVar15._0_8_ =
               (double)*(int *)((long)bins.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start + lVar3 + lVar9) / dVar18;
          auVar15._8_8_ = in_XMM7_Qb;
          auVar15 = vfmadd213sd_fma(auVar15,auVar19._0_16_,auVar20._0_16_);
          auVar15 = vandpd_avx(auVar15,auVar21._0_16_);
          auVar17 = vmaxsd_avx(auVar15,auVar17);
        }
        dVar16 = auVar17._0_8_;
        if (auVar14._0_8_ < dVar16) {
          local_98 = CONCAT44(local_98._4_4_,(int)uVar2);
          uVar10 = uVar11 & 0xffffffff;
          auVar14 = ZEXT1664(auVar17);
          local_a8 = (uint)uVar12;
        }
        if (verbose) {
          iVar5 = 0x2e;
          if ((0.01 <= dVar16) && (iVar5 = 0x6f, 0.05 <= dVar16)) {
            iVar5 = (uint)(0.33 <= dVar16) * 9 + 0x4f;
          }
          putchar(iVar5);
          auVar14 = ZEXT864(auVar14._0_8_);
          auVar19 = ZEXT1664(ZEXT816(0x4000000000000000));
          auVar20 = ZEXT1664(ZEXT816(0xbff0000000000000));
          auVar21 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
          dVar18 = local_a0;
        }
        lVar9 = lVar9 + 0x4000;
      }
      if (verbose) {
        putchar(10);
        auVar21 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
        auVar20 = ZEXT1664(ZEXT816(0xbff0000000000000));
        auVar19 = ZEXT1664(ZEXT816(0x4000000000000000));
        auVar14 = ZEXT864((ulong)auVar14._0_8_);
        dVar18 = local_a0;
      }
      lVar9 = local_78 + 0x10;
      uVar11 = local_80;
    }
    if (verbose) {
      iVar5 = 100;
      while (bVar13 = iVar5 != 0, iVar5 = iVar5 + -1, bVar13) {
        putchar(0x2d);
      }
      putchar(10);
      auVar14 = ZEXT864(auVar14._0_8_);
      auVar19 = ZEXT1664(ZEXT816(0x4000000000000000));
      auVar20 = ZEXT1664(ZEXT816(0xbff0000000000000));
      auVar21 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
      dVar18 = local_a0;
    }
    local_88 = local_88 + 0x210;
    uVar2 = local_80 + 1;
  }
  printf("Max bias %f - (%3d : %3d,%3d)\n",uVar10,(ulong)local_a8,local_98 & 0xffffffff);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&bins.super__Vector_base<int,_std::allocator<int>_>);
  return auVar14._0_8_ < 0.05;
}

Assistant:

bool BicTest3 ( pfHash hash, const int reps, bool verbose = false )
{
  const int keybytes = sizeof(keytype);
  const int keybits = keybytes * 8;
  const int hashbytes = sizeof(hashtype);
  const int hashbits = hashbytes * 8;
  const int pagesize = hashbits*hashbits*4;

  Rand r(11938);

  double maxBias = 0;
  int maxK = 0;
  int maxA = 0;
  int maxB = 0;

  keytype key;
  hashtype h1,h2;

  std::vector<int> bins(keybits*pagesize,0);

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    if(keybit % (keybits/10) == 0) printf(".");

    int * page = &bins[keybit*pagesize];

    for(int irep = 0; irep < reps; irep++)
    {
      r.rand_p(&key,keybytes);
      hash(&key,keybytes,0,&h1);
      flipbit(key,keybit);
      hash(&key,keybytes,0,&h2);

      hashtype d = h1 ^ h2;

      for(int out1 = 0; out1 < hashbits-1; out1++)
      for(int out2 = out1+1; out2 < hashbits; out2++)
      {
        int * b = &page[(out1*hashbits+out2)*4];

        uint32_t x = getbit(d,out1) | (getbit(d,out2) << 1);

        b[x]++;
      }
    }
  }

  printf("\n");

  for(int out1 = 0; out1 < hashbits-1; out1++)
  {
    for(int out2 = out1+1; out2 < hashbits; out2++)
    {
      if(verbose) printf("(%3d,%3d) - ",out1,out2);

      for(int keybit = 0; keybit < keybits; keybit++)
      {
        int * page = &bins[keybit*pagesize];
        int * bins = &page[(out1*hashbits+out2)*4];

        double bias = 0;

        for(int b = 0; b < 4; b++)
        {
          double b2 = double(bins[b]) / double(reps / 2);
          b2 = fabs(b2 * 2 - 1);

          if(b2 > bias) bias = b2;
        }

        if(bias > maxBias)
        {
          maxBias = bias;
          maxK = keybit;
          maxA = out1;
          maxB = out2;
        }

        if(verbose) 
        {
          if     (bias < 0.01) printf(".");
          else if(bias < 0.05) printf("o");
          else if(bias < 0.33) printf("O");
          else                 printf("X");
        }
      }

      // Finished keybit
      if(verbose) printf("\n");
    }

    if(verbose)
    {
      for(int i = 0; i < keybits+12; i++) printf("-");
      printf("\n");
    }
  }

  printf("Max bias %f - (%3d : %3d,%3d)\n",maxBias,maxK,maxA,maxB);

  // Bit independence is harder to pass than avalanche, so we're a bit more lax here.
  bool result = (maxBias < 0.05);
  return result;
}